

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

Session * __thiscall
FIX::Initiator::getSession(Initiator *this,SessionID *sessionID,Responder *responder)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  iterator i;
  Responder *responder_local;
  SessionID *sessionID_local;
  Initiator *this_local;
  
  i._M_node = (_Base_ptr)responder;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
       ::find(&this->m_sessions,sessionID);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
       ::end(&this->m_sessions);
  bVar1 = std::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator->
                       (&local_30);
    Session::setResponder(ppVar2->second,(Responder *)i._M_node);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator->
                       (&local_30);
    this_local = (Initiator *)ppVar2->second;
  }
  else {
    this_local = (Initiator *)0x0;
  }
  return (Session *)this_local;
}

Assistant:

Session *Initiator::getSession(const SessionID &sessionID, Responder &responder) {
  Sessions::iterator i = m_sessions.find(sessionID);
  if (i != m_sessions.end()) {
    i->second->setResponder(&responder);
    return i->second;
  }
  return 0;
}